

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void do_rot_90(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
              JDIMENSION y_crop_offset,jvirt_barray_ptr *src_coef_arrays,
              jvirt_barray_ptr *dst_coef_arrays)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  jpeg_component_info *compptr;
  JCOEFPTR dst_ptr;
  JCOEFPTR src_ptr;
  JBLOCKARRAY dst_buffer;
  JBLOCKARRAY src_buffer;
  int offset_y;
  int offset_x;
  int j;
  int i;
  int ci;
  JDIMENSION y_crop_blocks;
  JDIMENSION x_crop_blocks;
  JDIMENSION dst_blk_y;
  JDIMENSION dst_blk_x;
  JDIMENSION comp_width;
  JDIMENSION MCU_cols;
  undefined8 local_60;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_38;
  undefined4 local_34;
  
  uVar1 = *(uint *)(in_RDI + 0x8c);
  iVar2 = *(int *)(in_RSI + 0x138);
  for (local_44 = 0; local_44 < *(int *)(in_RSI + 0x4c); local_44 = local_44 + 1) {
    lVar6 = *(long *)(in_RSI + 0x58) + (long)local_44 * 0x60;
    uVar3 = (uVar1 / (uint)(iVar2 << 3)) * *(int *)(lVar6 + 8);
    iVar4 = in_EDX * *(int *)(lVar6 + 8);
    iVar5 = in_ECX * *(int *)(lVar6 + 0xc);
    for (local_38 = 0; local_38 < *(uint *)(lVar6 + 0x20);
        local_38 = *(int *)(lVar6 + 0xc) + local_38) {
      lVar7 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                        (in_RDI,*(undefined8 *)(in_R9 + (long)local_44 * 8),local_38,
                         *(undefined4 *)(lVar6 + 0xc),1);
      for (local_54 = 0; local_54 < *(int *)(lVar6 + 0xc); local_54 = local_54 + 1) {
        for (local_34 = 0; local_34 < *(uint *)(lVar6 + 0x1c);
            local_34 = *(int *)(lVar6 + 8) + local_34) {
          if (iVar4 + local_34 < uVar3) {
            local_60 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                                 (in_RDI,*(undefined8 *)(in_R8 + (long)local_44 * 8),
                                  ((uVar3 - iVar4) - local_34) - *(int *)(lVar6 + 8),
                                  *(undefined4 *)(lVar6 + 8));
          }
          else {
            local_60 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                                 (in_RDI,*(undefined8 *)(in_R8 + (long)local_44 * 8),
                                  local_34 + iVar4,*(undefined4 *)(lVar6 + 8),0);
          }
          for (local_50 = 0; local_50 < *(int *)(lVar6 + 8); local_50 = local_50 + 1) {
            lVar8 = *(long *)(lVar7 + (long)local_54 * 8) + (ulong)(local_34 + local_50) * 0x80;
            if (iVar4 + local_34 < uVar3) {
              lVar9 = *(long *)(local_60 + (long)((*(int *)(lVar6 + 8) - local_50) + -1) * 8) +
                      (ulong)(local_38 + local_54 + iVar5) * 0x80;
              for (local_48 = 0; local_48 < 8; local_48 = local_48 + 2) {
                for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
                  *(undefined2 *)(lVar8 + (long)(local_4c * 8 + local_48) * 2) =
                       *(undefined2 *)(lVar9 + (long)(local_48 * 8 + local_4c) * 2);
                }
                for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
                  *(short *)(lVar8 + (long)(local_4c * 8 + local_48 + 1) * 2) =
                       -*(short *)(lVar9 + (long)((local_48 + 1) * 8 + local_4c) * 2);
                }
              }
            }
            else {
              lVar9 = *(long *)(local_60 + (long)local_50 * 8);
              for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
                for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
                  *(undefined2 *)(lVar8 + (long)(local_4c * 8 + local_48) * 2) =
                       *(undefined2 *)
                        (lVar9 + (ulong)(local_38 + local_54 + iVar5) * 0x80 +
                        (long)(local_48 * 8 + local_4c) * 2);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
do_rot_90(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
          JDIMENSION x_crop_offset, JDIMENSION y_crop_offset,
          jvirt_barray_ptr *src_coef_arrays,
          jvirt_barray_ptr *dst_coef_arrays)
/* 90 degree rotation is equivalent to
 *   1. Transposing the image;
 *   2. Horizontal mirroring.
 * These two steps are merged into a single processing routine.
 */
{
  JDIMENSION MCU_cols, comp_width, dst_blk_x, dst_blk_y;
  JDIMENSION x_crop_blocks, y_crop_blocks;
  int ci, i, j, offset_x, offset_y;
  JBLOCKARRAY src_buffer, dst_buffer;
  JCOEFPTR src_ptr, dst_ptr;
  jpeg_component_info *compptr;

  /* Because of the horizontal mirror step, we can't process partial iMCUs
   * at the (output) right edge properly.  They just get transposed and
   * not mirrored.
   */
  MCU_cols = srcinfo->output_height /
             (dstinfo->max_h_samp_factor * dstinfo_min_DCT_h_scaled_size);

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    comp_width = MCU_cols * compptr->h_samp_factor;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    y_crop_blocks = y_crop_offset * compptr->v_samp_factor;
    for (dst_blk_y = 0; dst_blk_y < compptr->height_in_blocks;
         dst_blk_y += compptr->v_samp_factor) {
      dst_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, dst_coef_arrays[ci], dst_blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        for (dst_blk_x = 0; dst_blk_x < compptr->width_in_blocks;
             dst_blk_x += compptr->h_samp_factor) {
          if (x_crop_blocks + dst_blk_x < comp_width) {
            /* Block is within the mirrorable area. */
            src_buffer = (*srcinfo->mem->access_virt_barray)
              ((j_common_ptr)srcinfo, src_coef_arrays[ci],
               comp_width - x_crop_blocks - dst_blk_x -
               (JDIMENSION)compptr->h_samp_factor,
               (JDIMENSION)compptr->h_samp_factor, FALSE);
          } else {
            /* Edge blocks are transposed but not mirrored. */
            src_buffer = (*srcinfo->mem->access_virt_barray)
              ((j_common_ptr)srcinfo, src_coef_arrays[ci],
               dst_blk_x + x_crop_blocks,
               (JDIMENSION)compptr->h_samp_factor, FALSE);
          }
          for (offset_x = 0; offset_x < compptr->h_samp_factor; offset_x++) {
            dst_ptr = dst_buffer[offset_y][dst_blk_x + offset_x];
            if (x_crop_blocks + dst_blk_x < comp_width) {
              /* Block is within the mirrorable area. */
              src_ptr = src_buffer[compptr->h_samp_factor - offset_x - 1]
                [dst_blk_y + offset_y + y_crop_blocks];
              for (i = 0; i < DCTSIZE; i++) {
                for (j = 0; j < DCTSIZE; j++)
                  dst_ptr[j * DCTSIZE + i] = src_ptr[i * DCTSIZE + j];
                i++;
                for (j = 0; j < DCTSIZE; j++)
                  dst_ptr[j * DCTSIZE + i] = -src_ptr[i * DCTSIZE + j];
              }
            } else {
              /* Edge blocks are transposed but not mirrored. */
              src_ptr = src_buffer[offset_x]
                [dst_blk_y + offset_y + y_crop_blocks];
              for (i = 0; i < DCTSIZE; i++)
                for (j = 0; j < DCTSIZE; j++)
                  dst_ptr[j * DCTSIZE + i] = src_ptr[i * DCTSIZE + j];
            }
          }
        }
      }
    }
  }
}